

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * sx__vsnprintf_callback(char *buff,void *user,int len)

{
  int iVar1;
  long lVar2;
  code *pcVar3;
  int *piVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  iVar1 = len + 1;
  lVar2 = *(long *)((long)user + 8);
  if ((lVar2 == 0) || (*(int *)(lVar2 + -8) <= *(int *)(lVar2 + -4) + iVar1)) {
    iVar6 = 0;
    iVar8 = 0;
    if (lVar2 != 0) {
      iVar8 = *(int *)(lVar2 + -8) * 2;
    }
    if (lVar2 != 0) {
      iVar6 = *(int *)(lVar2 + -4);
    }
    iVar7 = iVar6 + iVar1;
    if (iVar6 + iVar1 < iVar8) {
      iVar7 = iVar8;
    }
    iVar6 = 8;
    if (8 < iVar7) {
      iVar6 = iVar7;
    }
    lVar9 = lVar2 + -8;
    if (lVar2 == 0) {
      lVar9 = 0;
    }
    piVar4 = (int *)(*(code *)**user)(lVar9,iVar6 + 8,0,
                                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c"
                                      ,"sx__vsnprintf_callback",0x45,(*user)[1]);
    if (piVar4 == (int *)0x0) {
      sx__mem_run_fail_callback
                ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/array.h",
                 0x6d);
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/array.h"
                        ,0x6d,"Out of memory");
      pcVar3 = (code *)swi(3);
      pcVar5 = (char *)(*pcVar3)();
      return pcVar5;
    }
    *piVar4 = iVar6;
    if (lVar2 == 0) {
      piVar4[1] = 0;
    }
    *(int **)((long)user + 8) = piVar4 + 2;
  }
  lVar2 = *(long *)((long)user + 8);
  piVar4 = (int *)(lVar2 + -4);
  *piVar4 = *piVar4 + iVar1;
  memcpy((void *)(*(int *)((long)user + 0x10) + lVar2),(char *)((long)user + 0x14),(long)len);
  *(int *)((long)user + 0x10) = *(int *)((long)user + 0x10) + len;
  return (char *)((long)user + 0x14);
}

Assistant:

static char* sx__vsnprintf_callback(char* buff, void* user, int len)
{
    sx_unused(buff);
    sx__printf_ctx* ctx = (sx__printf_ctx*)user;
    int len_ = len + 1;    // Reserve one character for null-termination
    sx_array_add(ctx->alloc, ctx->buff, len_);
    sx_memcpy(ctx->buff + ctx->len, ctx->tmp, len);
    ctx->len += len;
    return ctx->tmp;
}